

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QColor *color)

{
  QPaintEngineState *pQVar1;
  QPaintEnginePrivate *pQVar2;
  QPaintEngine *pQVar3;
  QPaintEngineState *pQVar4;
  float fVar5;
  QColor QVar6;
  
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar2 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar4 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar4 = (QPaintEngineState *)0x0;
  }
  QVar6 = qPremultiplyWithExtraAlpha
                    (color,pQVar4[0xfe].dirtyFlags.
                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i);
  pQVar2[9].systemViewport.d = QVar6._0_8_;
  *(int *)pQVar2[9].systemTransform.m_matrix[0] = QVar6.ct._4_4_;
  *(short *)((long)pQVar2[9].systemTransform.m_matrix[0] + 4) = QVar6.ct._8_2_;
  fVar5 = QColor::alphaF((QColor *)&pQVar2[9].systemViewport);
  if ((fVar5 <= 0.0) &&
     (pQVar4[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
      super_QFlagsStorage<QPaintEngine::DirtyFlag>.i == 0)) {
    return;
  }
  pQVar4 = pQVar2->q_ptr->state;
  if (((pQVar4 == (QPaintEngineState *)0x0) ||
      (pQVar3 = *(QPaintEngine **)(pQVar4 + 0x100), pQVar3 == (QPaintEngine *)0x0)) ||
     (((ulong)pQVar3[2].state & 1) == 0)) {
    pQVar3 = pQVar2[10].q_ptr;
  }
  pQVar2[9].systemClip.d = (QRegionData *)pQVar3;
  QSpanData::adjustSpanMethods((QSpanData *)&pQVar2[8].systemTransform);
  fillRect(this,r,(QSpanData *)&pQVar2[8].systemTransform);
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, const QColor &color)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::fillRect(): " << r << color;
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    d->solid_color_filler.solidColor = qPremultiplyWithExtraAlpha(color, s->intOpacity);

    if (d->solid_color_filler.solidColor.alphaF() <= 0.0f
        && s->composition_mode == QPainter::CompositionMode_SourceOver) {
        return;
    }
    d->solid_color_filler.clip = d->clip();
    d->solid_color_filler.adjustSpanMethods();
    fillRect(r, &d->solid_color_filler);
}